

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O3

bool __thiscall httplib::Server::process_and_close_socket(Server *this,socket_t sock)

{
  anon_class_48_6_b559e8da callback;
  bool bVar1;
  socket_t local_6c;
  socket_t *local_68;
  time_t *ptStack_60;
  time_t *local_58;
  time_t *ptStack_50;
  time_t *local_48;
  anon_class_8_1_8991fb9c *paStack_40;
  time_t local_38;
  time_t local_30;
  time_t local_28;
  time_t local_20;
  anon_class_8_1_8991fb9c local_18;
  
  local_20 = this->read_timeout_sec_;
  local_28 = this->read_timeout_usec_;
  local_30 = this->write_timeout_sec_;
  local_38 = this->write_timeout_usec_;
  paStack_40 = &local_18;
  local_68 = &local_6c;
  ptStack_60 = &local_20;
  local_58 = &local_28;
  ptStack_50 = &local_30;
  local_48 = &local_38;
  callback.read_timeout_sec = ptStack_60;
  callback.sock = local_68;
  callback.read_timeout_usec = local_58;
  callback.write_timeout_sec = ptStack_50;
  callback.write_timeout_usec = local_48;
  callback.callback = paStack_40;
  local_6c = sock;
  local_18.this = this;
  bVar1 = detail::
          process_server_socket_core<httplib::detail::process_server_socket<httplib::Server::process_and_close_socket(int)::_lambda(httplib::Stream&,bool,bool&)_1_>(int,unsigned_long,long,long,long,long,long,httplib::Server::process_and_close_socket(int)::_lambda(httplib::Stream&,bool,bool&)_1_)::_lambda(bool,bool&)_1_>
                    (sock,this->keep_alive_max_count_,this->keep_alive_timeout_sec_,callback);
  shutdown(sock,2);
  close(sock);
  return bVar1;
}

Assistant:

inline bool Server::process_and_close_socket(socket_t sock) {
        auto ret = detail::process_server_socket(
            sock, keep_alive_max_count_, keep_alive_timeout_sec_, read_timeout_sec_,
            read_timeout_usec_, write_timeout_sec_, write_timeout_usec_,
            [this](Stream& strm, bool close_connection, bool& connection_closed) {
                return process_request(strm, close_connection, connection_closed,
                    nullptr);
            });

        detail::shutdown_socket(sock);
        detail::close_socket(sock);
        return ret;
    }